

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall Hospital::validate_String_Must_Be_Number(Hospital *this,string *id)

{
  code *pcVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  int local_28;
  int local_24;
  int i;
  int countr;
  string *id_local;
  Hospital *this_local;
  
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_28) {
      lVar4 = std::__cxx11::string::length();
      if (local_24 == lVar4) {
        return true;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)id);
    if (((*pcVar3 < '0') ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)id), '9' < *pcVar3)) ||
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)id), *pcVar3 == '0')) break;
    local_24 = local_24 + 1;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool Hospital:: validate_String_Must_Be_Number(string id){
    int countr = 0;
    for (int i = 0; i <id.length() ; ++i) {
        if(id[i]>=48 && id[i]<=57 && id[0]!='0')countr ++;
        else {
            return false;
        }
    }
    if(countr == id.length())return true ;
}